

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::destroySslContext(TlsCryptographOpenSSL *this)

{
  long lVar1;
  int iVar2;
  __shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  long in_FS_OFFSET;
  QString errors;
  SSL *in_stack_ffffffffffffffc8;
  __shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (in_RDI[4]._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = q_SSL_in_init(in_stack_ffffffffffffffc8);
    if (((iVar2 == 0) && (((ulong)in_RDI[0xd]._M_refcount._M_pi & 1) == 0)) &&
       (iVar2 = q_SSL_shutdown(in_stack_ffffffffffffffc8), iVar2 != 1)) {
      QTlsBackendOpenSSL::getErrorsFromOpenSsl();
      QString::~QString((QString *)0x1507ec);
    }
    q_SSL_free((SSL *)0x1507fc);
    in_RDI[4]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::destroySslContext()
{
    if (ssl) {
        if (!q_SSL_in_init(ssl) && !systemOrSslErrorDetected) {
            // We do not send a shutdown alert here. Just mark the session as
            // resumable for qhttpnetworkconnection's "optimization", otherwise
            // OpenSSL won't start a session resumption.
            if (q_SSL_shutdown(ssl) != 1) {
                // Some error may be queued, clear it.
                const auto errors = QTlsBackendOpenSSL::getErrorsFromOpenSsl();
                Q_UNUSED(errors);
            }
        }
        q_SSL_free(ssl);
        ssl = nullptr;
    }
    sslContextPointer.reset();
}